

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::hufBuildEncTable(Int64 *frq,int *im,int *iM)

{
  AutoArray<unsigned_long_*,_65537> *pAVar1;
  int iVar2;
  int *piVar3;
  unsigned_long **ppuVar4;
  unsigned_long *puVar5;
  unsigned_long **ppuVar6;
  int *in_RDX;
  int *in_RSI;
  AutoArray<unsigned_long_*,_65537> *in_RDI;
  Int64 *in_stack_00000020;
  int j_1;
  int j;
  int m;
  int mm;
  AutoArray<unsigned_long,_65537> scode;
  int i;
  int nf;
  AutoArray<unsigned_long_*,_65537> fHeap;
  AutoArray<int,_65537> hlink;
  AutoArray<unsigned_long_*,_65537> *in_stack_fffffffffffffea0;
  int local_60;
  int local_5c;
  AutoArray local_48 [12];
  int local_3c;
  int local_38;
  AutoArray local_28 [8];
  AutoArray local_20 [8];
  int *local_18;
  int *local_10;
  AutoArray<unsigned_long_*,_65537> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AutoArray<int,_65537>::AutoArray((AutoArray<int,_65537> *)in_stack_fffffffffffffea0);
  AutoArray<unsigned_long_*,_65537>::AutoArray(in_stack_fffffffffffffea0);
  *local_10 = 0;
  while (local_8[*local_10]._data == (unsigned_long **)0x0) {
    *local_10 = *local_10 + 1;
  }
  local_38 = 0;
  for (local_3c = *local_10; iVar2 = local_3c, local_3c < 0x10001; local_3c = local_3c + 1) {
    piVar3 = AutoArray::operator_cast_to_int_(local_20);
    piVar3[local_3c] = iVar2;
    if (local_8[local_3c]._data != (unsigned_long **)0x0) {
      pAVar1 = local_8 + local_3c;
      ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
      ppuVar4[local_38] = (unsigned_long *)pAVar1;
      local_38 = local_38 + 1;
      *local_18 = local_3c;
    }
  }
  *local_18 = *local_18 + 1;
  local_8[*local_18]._data = (unsigned_long **)0x1;
  pAVar1 = local_8 + *local_18;
  ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
  ppuVar4[local_38] = (unsigned_long *)pAVar1;
  local_38 = local_38 + 1;
  ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
  AutoArray::operator_cast_to_unsigned_long__(local_28);
  std::make_heap<unsigned_long**,Imf_2_5::(anonymous_namespace)::FHeapCompare>(ppuVar4);
  AutoArray<unsigned_long,_65537>::AutoArray
            ((AutoArray<unsigned_long,_65537> *)in_stack_fffffffffffffea0);
  puVar5 = AutoArray::operator_cast_to_unsigned_long_(local_48);
  memset(puVar5,0,0x80008);
  while (1 < local_38) {
    ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    local_60 = (int)((ulong)((long)*ppuVar4 - (long)local_8) >> 3);
    ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    ppuVar6 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    std::pop_heap<unsigned_long**,Imf_2_5::(anonymous_namespace)::FHeapCompare>
              (ppuVar4,ppuVar6 + local_38);
    local_38 = local_38 + -1;
    ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    local_5c = (int)((ulong)((long)*ppuVar4 - (long)local_8) >> 3);
    ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    ppuVar6 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    std::pop_heap<unsigned_long**,Imf_2_5::(anonymous_namespace)::FHeapCompare>
              (ppuVar4,ppuVar6 + local_38);
    local_8[local_5c]._data =
         (unsigned_long **)((long)local_8[local_5c]._data + (long)local_8[local_60]._data);
    ppuVar4 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    ppuVar6 = AutoArray::operator_cast_to_unsigned_long__(local_28);
    std::push_heap<unsigned_long**,Imf_2_5::(anonymous_namespace)::FHeapCompare>
              (ppuVar4,ppuVar6 + local_38);
    while( true ) {
      puVar5 = AutoArray::operator_cast_to_unsigned_long_(local_48);
      puVar5[local_5c] = puVar5[local_5c] + 1;
      piVar3 = AutoArray::operator_cast_to_int_(local_20);
      if (piVar3[local_5c] == local_5c) break;
      piVar3 = AutoArray::operator_cast_to_int_(local_20);
      local_5c = piVar3[local_5c];
    }
    piVar3 = AutoArray::operator_cast_to_int_(local_20);
    piVar3[local_5c] = local_60;
    while( true ) {
      puVar5 = AutoArray::operator_cast_to_unsigned_long_(local_48);
      puVar5[local_60] = puVar5[local_60] + 1;
      piVar3 = AutoArray::operator_cast_to_int_(local_20);
      if (piVar3[local_60] == local_60) break;
      piVar3 = AutoArray::operator_cast_to_int_(local_20);
      local_60 = piVar3[local_60];
    }
  }
  AutoArray::operator_cast_to_unsigned_long_(local_48);
  hufCanonicalCodeTable(in_stack_00000020);
  puVar5 = AutoArray::operator_cast_to_unsigned_long_(local_48);
  memcpy(local_8,puVar5,0x80008);
  AutoArray<unsigned_long,_65537>::~AutoArray((AutoArray<unsigned_long,_65537> *)local_8);
  AutoArray<unsigned_long_*,_65537>::~AutoArray(local_8);
  AutoArray<int,_65537>::~AutoArray((AutoArray<int,_65537> *)local_8);
  return;
}

Assistant:

void
hufBuildEncTable
    (Int64*	frq,	// io: input frequencies [HUF_ENCSIZE], output table
     int*	im,	//  o: min frq index
     int*	iM)	//  o: max frq index
{
    //
    // This function assumes that when it is called, array frq
    // indicates the frequency of all possible symbols in the data
    // that are to be Huffman-encoded.  (frq[i] contains the number
    // of occurrences of symbol i in the data.)
    //
    // The loop below does three things:
    //
    // 1) Finds the minimum and maximum indices that point
    //    to non-zero entries in frq:
    //
    //     frq[im] != 0, and frq[i] == 0 for all i < im
    //     frq[iM] != 0, and frq[i] == 0 for all i > iM
    //
    // 2) Fills array fHeap with pointers to all non-zero
    //    entries in frq.
    //
    // 3) Initializes array hlink such that hlink[i] == i
    //    for all array entries.
    //

    AutoArray <int, HUF_ENCSIZE> hlink;
    AutoArray <Int64 *, HUF_ENCSIZE> fHeap;

    *im = 0;

    while (!frq[*im])
	(*im)++;

    int nf = 0;

    for (int i = *im; i < HUF_ENCSIZE; i++)
    {
	hlink[i] = i;

	if (frq[i])
	{
	    fHeap[nf] = &frq[i];
	    nf++;
	    *iM = i;
	}
    }

    //
    // Add a pseudo-symbol, with a frequency count of 1, to frq;
    // adjust the fHeap and hlink array accordingly.  Function
    // hufEncode() uses the pseudo-symbol for run-length encoding.
    //

    (*iM)++;
    frq[*iM] = 1;
    fHeap[nf] = &frq[*iM];
    nf++;

    //
    // Build an array, scode, such that scode[i] contains the number
    // of bits assigned to symbol i.  Conceptually this is done by
    // constructing a tree whose leaves are the symbols with non-zero
    // frequency:
    //
    //     Make a heap that contains all symbols with a non-zero frequency,
    //     with the least frequent symbol on top.
    //
    //     Repeat until only one symbol is left on the heap:
    //
    //         Take the two least frequent symbols off the top of the heap.
    //         Create a new node that has first two nodes as children, and
    //         whose frequency is the sum of the frequencies of the first
    //         two nodes.  Put the new node back into the heap.
    //
    // The last node left on the heap is the root of the tree.  For each
    // leaf node, the distance between the root and the leaf is the length
    // of the code for the corresponding symbol.
    //
    // The loop below doesn't actually build the tree; instead we compute
    // the distances of the leaves from the root on the fly.  When a new
    // node is added to the heap, then that node's descendants are linked
    // into a single linear list that starts at the new node, and the code
    // lengths of the descendants (that is, their distance from the root
    // of the tree) are incremented by one.
    //

    make_heap (&fHeap[0], &fHeap[nf], FHeapCompare());

    AutoArray <Int64, HUF_ENCSIZE> scode;
    memset (scode, 0, sizeof (Int64) * HUF_ENCSIZE);

    while (nf > 1)
    {
	//
	// Find the indices, mm and m, of the two smallest non-zero frq
	// values in fHeap, add the smallest frq to the second-smallest
	// frq, and remove the smallest frq value from fHeap.
	//

	int mm = fHeap[0] - frq;
	pop_heap (&fHeap[0], &fHeap[nf], FHeapCompare());
	--nf;

	int m = fHeap[0] - frq;
	pop_heap (&fHeap[0], &fHeap[nf], FHeapCompare());

	frq[m ] += frq[mm];
	push_heap (&fHeap[0], &fHeap[nf], FHeapCompare());

	//
	// The entries in scode are linked into lists with the
	// entries in hlink serving as "next" pointers and with
	// the end of a list marked by hlink[j] == j.
	//
	// Traverse the lists that start at scode[m] and scode[mm].
	// For each element visited, increment the length of the
	// corresponding code by one bit. (If we visit scode[j]
	// during the traversal, then the code for symbol j becomes
	// one bit longer.)
	//
	// Merge the lists that start at scode[m] and scode[mm]
	// into a single list that starts at scode[m].
	//
	
	//
	// Add a bit to all codes in the first list.
	//

	for (int j = m; true; j = hlink[j])
	{
	    scode[j]++;

	    assert (scode[j] <= 58);

	    if (hlink[j] == j)
	    {
		//
		// Merge the two lists.
		//

		hlink[j] = mm;
		break;
	    }
	}

	//
	// Add a bit to all codes in the second list
	//

	for (int j = mm; true; j = hlink[j])
	{
	    scode[j]++;

	    assert (scode[j] <= 58);

	    if (hlink[j] == j)
		break;
	}
    }

    //
    // Build a canonical Huffman code table, replacing the code
    // lengths in scode with (code, code length) pairs.  Copy the
    // code table from scode into frq.
    //

    hufCanonicalCodeTable (scode);
    memcpy (frq, scode, sizeof (Int64) * HUF_ENCSIZE);
}